

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O3

void gen_enum_match(fb_output_t *out,fb_compound_type_t *ct,void *data,int hint,int n)

{
  fb_scalar_type_t fVar1;
  undefined4 in_register_0000000c;
  long lVar2;
  char *format;
  fb_output_t *out_00;
  
  println(out,"buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, %d, aggregate);",
          (ulong)(uint)n,CONCAT44(in_register_0000000c,hint));
  out_00 = out;
  println(out,"if (buf != mark) {");
  out->indent = out->indent + 1;
  fVar1 = (ct->type).field_0.st;
  if (fVar1 - fb_ulong < 5) {
    lVar2 = *(long *)((long)data + 0x48);
  }
  else {
    if (3 < fVar1 - fb_long) {
      gen_enum_match_cold_1();
      println(out_00,"return unmatched;");
      return;
    }
    lVar2 = *(long *)((long)data + 0x48);
    if (lVar2 < 0) {
      format = "*value = UINT64_C(%lu), *value_sign = 1;";
      goto LAB_00113a0a;
    }
  }
  format = "*value = UINT64_C(%lu), *value_sign = 0;";
LAB_00113a0a:
  println(out,format,lVar2);
  if (out->indent != 0) {
    out->indent = out->indent + -1;
    println(out,"} else {");
    out->indent = out->indent + 1;
    return;
  }
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x304,"void gen_enum_match(fb_output_t *, fb_compound_type_t *, void *, int, int)")
  ;
}

Assistant:

static void gen_enum_match(fb_output_t *out, fb_compound_type_t *ct, void *data, int hint, int n)
{
    println(out, "buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, %d, aggregate);", n);
    println(out, "if (buf != mark) {"); indent();
    gen_enum_match_handler(out, ct, data, hint);
    unindent(); println(out, "} else {"); indent();
}